

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int test_describe_server_certificates(void)

{
  code *pcVar1;
  char *__s;
  SlbDescribeServerCertificatesRequestType *pSVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1a1;
  int ret;
  HttpTestListener *local_180;
  HttpTestListener *listener;
  string local_170;
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [55];
  allocator<char> local_e9;
  string local_e8 [32];
  SlbDescribeServerCertificatesRequestType *local_c8;
  Slb *slb;
  SlbDescribeServerCertificatesResponseType resp;
  SlbDescribeServerCertificatesRequestType req;
  
  aliyun::SlbDescribeServerCertificatesRequestType::SlbDescribeServerCertificatesRequestType
            ((SlbDescribeServerCertificatesRequestType *)
             &resp.server_certificates.
              super__Vector_base<aliyun::SlbDescribeServerCertificatesServerCertificateType,_std::allocator<aliyun::SlbDescribeServerCertificatesServerCertificateType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  aliyun::SlbDescribeServerCertificatesResponseType::SlbDescribeServerCertificatesResponseType
            ((SlbDescribeServerCertificatesResponseType *)&slb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"cn-hangzhou",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"my_appid",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_148,"my_secret",&local_149);
  pSVar2 = (SlbDescribeServerCertificatesRequestType *)
           aliyun::Slb::CreateSlbClient(local_e8,local_120,local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  local_c8 = pSVar2;
  if (pSVar2 == (SlbDescribeServerCertificatesRequestType *)0x0) {
    aliyun::SlbDescribeServerCertificatesResponseType::~SlbDescribeServerCertificatesResponseType
              ((SlbDescribeServerCertificatesResponseType *)&slb);
    aliyun::SlbDescribeServerCertificatesRequestType::~SlbDescribeServerCertificatesRequestType
              ((SlbDescribeServerCertificatesRequestType *)
               &resp.server_certificates.
                super__Vector_base<aliyun::SlbDescribeServerCertificatesServerCertificateType,_std::allocator<aliyun::SlbDescribeServerCertificatesServerCertificateType>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetProxyHost((Slb *)pSVar2,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Slb::SetUseTls((Slb *)local_c8,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_server_certificates_response;
  local_180 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1a1);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1a1);
  HttpTestListener::Start(local_180);
  std::__cxx11::string::operator=
            ((string *)
             &resp.server_certificates.
              super__Vector_base<aliyun::SlbDescribeServerCertificatesServerCertificateType,_std::allocator<aliyun::SlbDescribeServerCertificatesServerCertificateType>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"ServerCertificateId");
  std::__cxx11::string::operator=
            ((string *)(req.server_certificate_id.field_2._M_local_buf + 8),"OwnerAccount");
  aliyun::Slb::DescribeServerCertificates
            (local_c8,(SlbDescribeServerCertificatesResponseType *)
                      &resp.server_certificates.
                       super__Vector_base<aliyun::SlbDescribeServerCertificatesServerCertificateType,_std::allocator<aliyun::SlbDescribeServerCertificatesServerCertificateType>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(SlbErrorInfo *)&slb);
  HttpTestListener::WaitComplete(local_180);
  pHVar3 = local_180;
  if (local_180 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_180);
    operator_delete(pHVar3,0x180);
  }
  pSVar2 = local_c8;
  if (local_c8 != (SlbDescribeServerCertificatesRequestType *)0x0) {
    aliyun::Slb::~Slb((Slb *)local_c8);
    operator_delete(pSVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_server_certificates() {
  SlbDescribeServerCertificatesRequestType req;
  SlbDescribeServerCertificatesResponseType resp;
  Slb* slb = Slb::CreateSlbClient("cn-hangzhou", "my_appid", "my_secret");
  if(!slb) return 0;
  slb->SetProxyHost("127.0.0.1:12234");
  slb->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_server_certificates_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.server_certificate_id = "ServerCertificateId";
  req.owner_account = "OwnerAccount";
  int ret = slb->DescribeServerCertificates(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete slb;
}